

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  u8 uVar1;
  u16 uVar2;
  uint uVar3;
  MemPage *pMVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)flags;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\0') {
    uVar2 = pCur->ix;
    uVar6 = uVar2 + 1;
    pCur->ix = uVar6;
    if (pCur->pPage->nCell <= uVar6) {
      pCur->ix = uVar2;
      iVar5 = btreeNext(pCur);
      return iVar5;
    }
    if (pCur->pPage->leaf != '\0') {
      return 0;
    }
    pMVar4 = pCur->pPage;
    uVar1 = pMVar4->leaf;
    while( true ) {
      if (uVar1 != '\0') {
        return 0;
      }
      uVar3 = *(uint *)(pMVar4->aData +
                       (CONCAT11(pMVar4->aCellIdx[(ulong)pCur->ix * 2],
                                 pMVar4->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar4->maskPage));
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar5 != 0) break;
      pMVar4 = pCur->pPage;
      uVar1 = pMVar4->leaf;
    }
    return iVar5;
  }
  if (pCur->eState != 0) {
    iVar5 = 0;
    if (2 < pCur->eState) {
      iVar5 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar4 = pCur->pPage;
  uVar6 = pCur->ix + 1;
  pCur->ix = uVar6;
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar5 = (*sqlite3Config.xTestCallback)(0x19c), iVar5 != 0)) {
    pMVar4->isInit = '\0';
  }
  if (pMVar4->isInit == '\0') {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x127cd,
                "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
    return 0xb;
  }
  if (uVar6 < pMVar4->nCell) {
    if (pMVar4->leaf == '\0') {
LAB_00152354:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar4->leaf == '\0') {
      uVar3 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_00152354;
    }
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,(int)uVar7);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->pPage;
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}